

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BIT_STRING.c
# Opt level: O1

int BIT_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                    void *app_key)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  char scratch [64];
  char local_78 [72];
  
  if ((sptr == (void *)0x0) || (pbVar4 = *sptr, pbVar4 == (byte *)0x0)) {
    iVar1 = (*cb)("<absent>",8,app_key);
    iVar1 = iVar1 >> 0x1f;
  }
  else {
    pcVar6 = local_78;
    if (0 < (long)*(int *)((long)sptr + 8)) {
      pbVar3 = pbVar4 + *(int *)((long)sptr + 8);
      do {
        pcVar5 = pcVar6;
        if (((((int)pbVar4 - (int)*sptr & 0xfU) == 0) && (pbVar4 != *sptr)) &&
           (0x10 < *(int *)((long)sptr + 8))) {
          iVar1 = (*cb)("\n",1,app_key);
          if (iVar1 < 0) {
            return -1;
          }
          iVar1 = ilevel + 1;
          if (-1 < ilevel) {
            do {
              iVar2 = (*cb)(" ",1,app_key);
              if (iVar2 < 0) {
                return -1;
              }
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          pcVar5 = local_78;
          iVar1 = (*cb)(pcVar5,(long)pcVar6 - (long)pcVar5,app_key);
          if (iVar1 < 0) {
            return -1;
          }
        }
        *pcVar5 = "0123456789ABCDEF"[*pbVar4 >> 4];
        pcVar5[1] = "0123456789ABCDEF"[*pbVar4 & 0xf];
        pcVar5[2] = ' ';
        pcVar6 = pcVar5 + 3;
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 < pbVar3);
    }
    if (local_78 < pcVar6) {
      if (0x10 < *(int *)((long)sptr + 8)) {
        iVar1 = (*cb)("\n",1,app_key);
        if (iVar1 < 0) {
          return -1;
        }
        if (-1 < ilevel) {
          iVar1 = ilevel + 1;
          do {
            iVar2 = (*cb)(" ",1,app_key);
            if (iVar2 < 0) {
              return -1;
            }
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
      }
      iVar1 = (*cb)(local_78,(size_t)(pcVar6 + (-1 - (long)local_78)),app_key);
      if (iVar1 < 0) {
        return -1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
BIT_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	char scratch[64];
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	uint8_t *buf;
	uint8_t *end;
	char *p = scratch;

	(void)td;	/* Unused argument */

	if(!st || !st->buf)
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	ilevel++;
	buf = st->buf;
	end = buf + st->size;

	/*
	 * Hexadecimal dump.
	 */
	for(; buf < end; buf++) {
		if((buf - st->buf) % 16 == 0 && (st->size > 16)
				&& buf != st->buf) {
			_i_INDENT(1);
			/* Dump the string */
			if(cb(scratch, p - scratch, app_key) < 0) return -1;
			p = scratch;
		}
		*p++ = h2c[*buf >> 4];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Eat the tailing space */

		if((st->size > 16)) {
			_i_INDENT(1);
		}

		/* Dump the incomplete 16-bytes row */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}